

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void expulsion(boolean seal)

{
  ushort uVar1;
  branch *pbVar2;
  int local_3c;
  d_level *local_38;
  int reexpelled;
  int portal_flag;
  trap *t;
  d_level *dest;
  branch *br;
  boolean seal_local;
  
  pbVar2 = dungeon_branch("The Quest");
  if ((pbVar2->end1).dnum == u.uz.dnum) {
    local_38 = &pbVar2->end2;
  }
  else {
    local_38 = &pbVar2->end1;
  }
  if (((ushort)u.uevent._0_2_ >> 4 & 1) == 0) {
    local_3c = -1;
    if (seal == '\0') {
      local_3c = 1;
    }
  }
  else {
    local_3c = 0;
  }
  schedule_goto(local_38,'\0','\0',local_3c,(char *)0x0,(char *)0x0);
  if (seal != '\0') {
    uVar1 = (ushort)u.uevent._0_2_ >> 4;
    u.uevent._0_2_ = u.uevent._0_2_ & 0xffef | 0x10;
    historic_event('\0',"were expelled from the quest.");
    for (_reexpelled = level->lev_traps;
        (_reexpelled != (trap *)0x0 && ((_reexpelled->field_0x8 & 0x1f) != 0x12));
        _reexpelled = _reexpelled->ntrap) {
    }
    if (_reexpelled == (trap *)0x0) {
      if ((uVar1 & 1) == 0) {
        impossible("quest portal already gone?");
      }
    }
    else {
      deltrap(level,_reexpelled);
    }
  }
  return;
}

Assistant:

static void expulsion(boolean seal)
{
    branch *br;
    d_level *dest;
    struct trap *t;
    int portal_flag;

    br = dungeon_branch("The Quest");
    dest = (br->end1.dnum == u.uz.dnum) ? &br->end2 : &br->end1;
    portal_flag = u.uevent.qexpelled ? 0 :	/* returned via artifact? */
		  !seal ? 1 : -1;
    schedule_goto(dest, FALSE, FALSE, portal_flag, NULL, NULL);
    if (seal) {	/* remove the portal to the quest - sealing it off */
	int reexpelled = u.uevent.qexpelled;
	u.uevent.qexpelled = 1;
	historic_event(FALSE, "were expelled from the quest.");
	/* Delete the near portal now; the far (main dungeon side)
	   portal will be deleted as part of arrival on that level.
	   If monster movement is in progress, any who haven't moved
	   yet will now miss out on a chance to wander through it... */
	for (t = level->lev_traps; t; t = t->ntrap)
	    if (t->ttyp == MAGIC_PORTAL) break;
	if (t) deltrap(level, t);	/* (display might be briefly out of sync) */
	else if (!reexpelled) impossible("quest portal already gone?");
    }
}